

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::NetState::ByteSizeLong(NetState *this)

{
  bool bVar1;
  int iVar2;
  int32 value;
  Phase value_00;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  string *value_01;
  int cached_size;
  int n;
  int i;
  size_t total_size;
  NetState *this_local;
  
  _n = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetState::unknown_fields(this);
    _n = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  iVar2 = stage_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  _n = sVar3 + _n;
  cached_size = 0;
  iVar2 = stage_size(this);
  for (; cached_size < iVar2; cached_size = cached_size + 1) {
    value_01 = stage_abi_cxx11_(this,cached_size);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value_01);
    _n = sVar3 + _n;
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_level(this);
    if (bVar1) {
      value = level(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(value);
      _n = sVar3 + 1 + _n;
    }
    bVar1 = has_phase(this);
    if (bVar1) {
      value_00 = phase(this);
      sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      _n = sVar3 + 1 + _n;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_n);
  this->_cached_size_ = iVar2;
  return _n;
}

Assistant:

size_t NetState::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetState)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string stage = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->stage_size());
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->stage(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional int32 level = 2 [default = 0];
    if (has_level()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->level());
    }

    // optional .caffe.Phase phase = 1 [default = TEST];
    if (has_phase()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->phase());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}